

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_skip_list.c
# Opt level: O0

void test_skiplist_delete_then_insert_single(planck_unit_test_t *tc)

{
  planck_unit_result_t pVar1;
  bool bVar2;
  undefined4 local_78;
  ion_status_t local_74;
  undefined4 local_6c;
  ion_status_t local_68;
  char *local_60;
  undefined4 local_54;
  ion_status_t local_50;
  ion_status_t status;
  ion_skiplist_t skiplist;
  planck_unit_test_t *tc_local;
  
  initialize_skiplist_std_conditions((ion_skiplist_t *)&status);
  local_54 = 0x42;
  local_60 = "toaster";
  local_50 = sl_insert((ion_skiplist_t *)&status,&local_54,"toaster");
  pVar1 = planck_unit_assert_true
                    (tc,(uint)(local_50.error == '\0'),0x63e,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                     ,"condition was false, expected true");
  if (pVar1 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  pVar1 = planck_unit_assert_true
                    (tc,(uint)(local_50.count == 1),0x63f,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                     ,"condition was false, expected true");
  if (pVar1 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  local_6c = 0x42;
  local_68 = sl_delete((ion_skiplist_t *)&status,&local_6c);
  local_50.error = local_68.error;
  bVar2 = local_50.error == '\0';
  local_50 = local_68;
  pVar1 = planck_unit_assert_true
                    (tc,(uint)bVar2,0x648,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                     ,"condition was false, expected true");
  if (pVar1 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  pVar1 = planck_unit_assert_true
                    (tc,(uint)(local_50.count == 1),0x649,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                     ,"condition was false, expected true");
  if (pVar1 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  local_78 = 0x16d;
  local_74 = sl_insert((ion_skiplist_t *)&status,&local_78,"potato");
  local_50.error = local_74.error;
  bVar2 = local_50.error == '\0';
  local_50 = local_74;
  pVar1 = planck_unit_assert_true
                    (tc,(uint)bVar2,0x657,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                     ,"condition was false, expected true");
  if (pVar1 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  pVar1 = planck_unit_assert_true
                    (tc,(uint)(local_50.count == 1),0x658,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                     ,"condition was false, expected true");
  if (pVar1 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  pVar1 = planck_unit_assert_true
                    (tc,(uint)(**(long **)(skiplist.super._24_8_ + 0x18) != 0),0x659,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                     ,"condition was false, expected true");
  if (pVar1 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  pVar1 = planck_unit_assert_true
                    (tc,(uint)(**(int **)**(undefined8 **)(skiplist.super._24_8_ + 0x18) == 0x16d),
                     0x65a,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                     ,"condition was false, expected true");
  if (pVar1 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  pVar1 = planck_unit_assert_str_are_equal
                    (tc,*(char **)(**(long **)(skiplist.super._24_8_ + 0x18) + 8),"potato",0x65b,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                    );
  if (pVar1 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  sl_destroy((ion_skiplist_t *)&status);
  return;
}

Assistant:

void
test_skiplist_delete_then_insert_single(
	planck_unit_test_t *tc
) {
	PRINT_HEADER();

	ion_skiplist_t skiplist;

	initialize_skiplist_std_conditions(&skiplist);

	ion_status_t status = sl_insert(&skiplist, IONIZE(66, int), (ion_value_t) (char *) { "toaster" });

	PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
	PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);

#if ION_DEBUG
	printf("%s\n", "** INSERT **");
	print_skiplist(&skip_list);
#endif

	status = sl_delete(&skiplist, IONIZE(66, int));

	PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
	PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);

#if ION_DEBUG
	printf("%s\n", "** DELETE **");
	print_skiplist(&skip_list);
#endif

	status = sl_insert(&skiplist, IONIZE(365, int), (ion_value_t) (char *) { "potato" });

#if ION_DEBUG
	printf("%s\n", "** REINSERT **");
	print_skiplist(&skip_list);
#endif

	PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
	PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);
	PLANCK_UNIT_ASSERT_TRUE(tc, skiplist.head->next[0] != NULL);
	PLANCK_UNIT_ASSERT_TRUE(tc, *(int *) skiplist.head->next[0]->key == 365);
	PLANCK_UNIT_ASSERT_STR_ARE_EQUAL(tc, (char *) skiplist.head->next[0]->value, "potato");

	sl_destroy(&skiplist);
}